

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

EnumPort * __thiscall
kratos::Generator::port
          (Generator *this,PortDirection direction,string *port_name,shared_ptr<kratos::Enum> *def)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  VarException *this_00;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  bool *pbVar3;
  UserException *this_02;
  element_type *peVar4;
  char (*format_str) [45];
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::EnumPort> sVar5;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  Generator *local_1f0;
  undefined1 local_1e8 [8];
  shared_ptr<kratos::EnumPort> p;
  string local_1d0;
  undefined1 local_1aa;
  allocator<const_kratos::IRNode_*> local_1a9;
  element_type *local_1a8;
  element_type **local_1a0;
  size_type local_198;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_190;
  string local_168;
  _Self local_148;
  _Self local_140;
  __shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_138;
  shared_ptr<kratos::Enum> *def_local;
  string *port_name_local;
  Generator *pGStack_120;
  PortDirection direction_local;
  Generator *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_110;
  basic_string_view<char> local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  shared_ptr<kratos::Enum> *local_c0;
  char *local_b8;
  string *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_138 = (__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)def;
  def_local = (shared_ptr<kratos::Enum> *)port_name;
  port_name_local._4_4_ = direction;
  pGStack_120 = this;
  local_140._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->ports_,port_name);
  local_148._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->ports_);
  bVar1 = std::operator!=(&local_140,&local_148);
  if (bVar1) {
    local_1aa = 1;
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&this->name;
    local_b0 = &local_168;
    local_b8 = "{0} already exists in {1}";
    local_c0 = def_local;
    fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[26],char>
              (&local_f8,(v7 *)0x41f05e,(char (*) [26])def_local,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_d0 = &local_f8;
    local_108 = fmt::v7::to_string_view<char,_0>(local_b8);
    local_50 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_58 = local_d0;
    local_48 = local_d0;
    local_38 = local_d0;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_d0);
    format_str_00.size_ = (size_t)this_local;
    format_str_00.data_ = (char *)local_108.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_110.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_168,(detail *)local_108.data_,format_str_00,args);
    this_01 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               ::at(&this->vars_,(key_type *)def_local)->
               super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
    local_1a8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    local_1a0 = &local_1a8;
    local_198 = 1;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_1a9);
    __l._M_len = local_198;
    __l._M_array = (iterator)local_1a0;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_190,__l,&local_1a9);
    VarException::VarException(this_00,&local_168,&local_190);
    local_1aa = 0;
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  peVar2 = std::__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_138);
  pbVar3 = Enum::local(peVar2);
  if ((*pbVar3 & 1U) != 0) {
    p.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
    this_02 = (UserException *)__cxa_allocate_exception(0x10);
    peVar2 = std::__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_138);
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&peVar2->name;
    local_60 = &local_1d0;
    local_68 = "Cannot use {0} as port type since it\'s local";
    local_88.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string&,char[45],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"Cannot use {0} as port type since it\'s local",(v7 *)vargs_1,format_str,
                    (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                    "Cannot use {0} as port type since it\'s local");
    local_78 = &local_88;
    local_98 = fmt::v7::to_string_view<char,_0>(local_68);
    local_28 = &local_a8;
    local_30 = local_78;
    local_20 = local_78;
    local_10 = local_78;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_78->string);
    format_str_01.size_ = local_a8.desc_;
    format_str_01.data_ = (char *)local_98.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_1d0,(detail *)local_98.data_,format_str_01,args_00);
    UserException::UserException(this_02,&local_1d0);
    p.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
    __cxa_throw(this_02,&UserException::typeinfo,UserException::~UserException);
  }
  local_1f0 = this;
  sVar5 = std::
          make_shared<kratos::EnumPort,kratos::Generator*,kratos::PortDirection&,std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>const&>
                    ((Generator **)local_1e8,(PortDirection *)&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&port_name_local + 4),def_local);
  (*(this->super_IRNode)._vptr_IRNode[7])
            (this,def_local,
             sVar5.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumPort>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)def_local,
             (shared_ptr<kratos::EnumPort> *)local_1e8);
  peVar4 = std::__shared_ptr_access<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_1e8);
  std::shared_ptr<kratos::EnumPort>::~shared_ptr((shared_ptr<kratos::EnumPort> *)local_1e8);
  return peVar4;
}

Assistant:

EnumPort &Generator::port(kratos::PortDirection direction, const std::string &port_name,
                          const std::shared_ptr<kratos::Enum> &def) {
    if (ports_.find(port_name) != ports_.end())
        throw VarException(::format("{0} already exists in {1}", port_name, name),
                           {vars_.at(port_name).get()});
    // make sure the enum def is not local
    if (def->local())
        throw UserException(::format("Cannot use {0} as port type since it's local", def->name));
    auto p = std::make_shared<EnumPort>(this, direction, port_name, def);
    add_port_name(port_name);
    vars_.emplace(port_name, p);
    return *p;
}